

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::texture::anon_unknown_0::TextureCubeLodControlTestInstance::iterate
          (TestStatus *__return_storage_ptr__,TextureCubeLodControlTestInstance *this)

{
  TextureRenderer *this_00;
  deUint32 *this_01;
  uint uVar1;
  int iVar2;
  int iVar3;
  int height;
  TestLog *pTVar4;
  bool bVar5;
  int iVar6;
  deUint32 width;
  deUint32 dVar7;
  uint uVar8;
  int iVar9;
  undefined4 extraout_var;
  TextureBinding *this_02;
  undefined4 extraout_var_00;
  Surface *pSVar11;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  long lVar12;
  void *pvVar13;
  ulong uVar14;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> gridLayout;
  undefined1 local_4c8 [40];
  undefined1 local_4a0 [44];
  deUint32 local_474;
  undefined1 local_470 [40];
  vector<float,_std::allocator<float>_> texCoord;
  PixelFormat local_428;
  undefined1 local_418 [40];
  undefined8 *local_3f0;
  Surface referenceFrame;
  Surface renderedFrame;
  Surface errorMask;
  LodPrecision lodPrec;
  LookupPrecision local_388;
  Random rnd;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  int local_338;
  undefined1 auStack_334 [84];
  ios_base local_2e0 [264];
  Vector<int,_4> res;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  _Alloc_hider local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [6];
  IVec4 formatBitDepth;
  undefined1 local_12c [92];
  ConstPixelBufferAccess *pCStack_d0;
  int local_c8;
  bool local_b4;
  undefined7 uStack_b3;
  LodMode local_ac;
  deUint32 local_a0;
  deUint32 local_9c;
  PixelBufferAccess local_98;
  Sampler sampler;
  long lVar10;
  
  iVar6 = (*(((this->m_texture).m_ptr)->super_TestTexture)._vptr_TestTexture[0x11])();
  local_3f0 = (undefined8 *)CONCAT44(extraout_var,iVar6);
  this_00 = &this->m_renderer;
  width = util::TextureRenderer::getRenderWidth(this_00);
  dVar7 = util::TextureRenderer::getRenderHeight(this_00);
  util::createSampler(&sampler,CLAMP_TO_EDGE,CLAMP_TO_EDGE,this->m_minFilter,NEAREST);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_12c,TEXTURETYPE_CUBE,&sampler,LODMODE_EXACT);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tcu::Surface::Surface(&renderedFrame,width,dVar7);
  uVar1 = this->m_texSize;
  if (uVar1 == 0) {
    uVar8 = 0x20;
  }
  else {
    uVar8 = 0x1f;
    if (uVar1 != 0) {
      for (; uVar1 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    uVar8 = uVar8 ^ 0x1f;
  }
  local_9c = 0x1f - uVar8;
  gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deRandom_init(&rnd.m_rnd,7);
  randomPartition(&gridLayout,&rnd,0,0,width,dVar7);
  local_474 = dVar7;
  if (0 < (int)((ulong)((long)gridLayout.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)gridLayout.
                             super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
    lVar12 = 0xc;
    uVar14 = 0;
    do {
      iVar6 = *(int *)((long)(gridLayout.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12 + -0xc);
      iVar9 = *(int *)((long)(gridLayout.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12 + -8);
      iVar2 = *(int *)((long)(gridLayout.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12 + -4);
      iVar3 = *(int *)((long)(gridLayout.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12);
      glu::TextureTestUtil::computeQuadTexCoordCube
                (&texCoord,(int)uVar14 + (int)((uVar14 & 0xffffffff) / 6) * -6);
      (*(this->super_TestInstance)._vptr_TestInstance[3])(this,local_12c,uVar14 & 0xffffffff);
      util::TextureRenderer::setViewport
                (this_00,(float)iVar6,(float)iVar9,(float)iVar2,(float)iVar3);
      this_02 = util::TextureRenderer::getTextureBinding(this_00,0);
      util::TextureBinding::updateTextureViewMipLevels(this_02,local_a0,local_9c);
      util::TextureRenderer::renderQuad
                (this_00,&renderedFrame,0,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,(ReferenceParams *)local_12c);
      uVar14 = uVar14 + 1;
      lVar12 = lVar12 + 0x10;
    } while ((long)uVar14 <
             (long)(int)((ulong)((long)gridLayout.
                                       super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)gridLayout.
                                      super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4));
  }
  rnd.m_rnd._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::getTextureFormatBitDepth((tcu *)&formatBitDepth,(TextureFormat *)&rnd);
  dVar7 = local_474;
  local_428.redBits = formatBitDepth.m_data[0];
  local_428.greenBits = formatBitDepth.m_data[1];
  local_428.blueBits = formatBitDepth.m_data[2];
  local_428.alphaBits = formatBitDepth.m_data[3];
  tcu::Surface::Surface(&referenceFrame,width,local_474);
  tcu::Surface::Surface(&errorMask,width,dVar7);
  local_388.coordBits.m_data[0] = 0x16;
  local_388.coordBits.m_data[1] = 0x16;
  local_388.coordBits.m_data[2] = 0x16;
  local_388.uvwBits.m_data[0] = 0x10;
  local_388.uvwBits.m_data[1] = 0x10;
  local_388.uvwBits.m_data[2] = 0x10;
  local_388.colorThreshold.m_data[0] = 0.0;
  local_388.colorThreshold.m_data[1] = 0.0;
  local_388.colorThreshold.m_data[2] = 0.0;
  local_388.colorThreshold.m_data[3] = 0.0;
  local_388.colorMask.m_data[0] = true;
  local_388.colorMask.m_data[1] = true;
  local_388.colorMask.m_data[2] = true;
  local_388.colorMask.m_data[3] = true;
  lodPrec.rule = RULE_VULKAN;
  lodPrec.derivateBits = 0x16;
  lodPrec.lodBits = 0x10;
  util::createSampler((Sampler *)&rnd,CLAMP_TO_EDGE,CLAMP_TO_EDGE,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter,NEAREST);
  local_c8 = local_338;
  local_12c._84_8_ = local_348._M_allocated_capacity;
  pCStack_d0 = (ConstPixelBufferAccess *)local_348._8_8_;
  local_12c._68_4_ = rnd.m_rnd.x;
  local_12c._72_4_ = rnd.m_rnd.y;
  local_12c._76_4_ = rnd.m_rnd.z;
  local_12c._80_4_ = rnd.m_rnd.w;
  uStack_b3 = (undefined7)(CONCAT44(auStack_334._20_4_,auStack_334._16_4_) >> 8);
  local_b4 = true;
  local_ac = LODMODE_EXACT;
  local_388.colorMask.m_data[1] = 0 < local_428.greenBits;
  local_388.colorMask.m_data[0] = 0 < local_428.redBits;
  local_388.colorMask.m_data[2] = 0 < local_428.blueBits;
  local_388.colorMask.m_data[3] = 0 < local_428.alphaBits;
  res.m_data[0] = -(uint)(0 < (int)(local_428.redBits - 2U)) & local_428.redBits - 2U;
  res.m_data[1] = -(uint)(0 < (int)(local_428.greenBits - 2U)) & local_428.greenBits - 2U;
  res.m_data[2] = -(uint)(0 < (int)(local_428.blueBits - 2U)) & local_428.blueBits - 2U;
  res.m_data[3] = -(uint)(0 < (int)(local_428.alphaBits - 2U)) & local_428.alphaBits - 2U;
  tcu::computeFixedPointThreshold((tcu *)&rnd,&res);
  local_388.colorThreshold.m_data[2] = (float)rnd.m_rnd.z;
  local_388.colorThreshold.m_data[3] = (float)rnd.m_rnd.w;
  local_388.colorThreshold.m_data[0] = (float)rnd.m_rnd.x;
  local_388.colorThreshold.m_data[1] = (float)rnd.m_rnd.y;
  local_388.coordBits.m_data[0] = 10;
  local_388.coordBits.m_data[1] = 10;
  local_388.coordBits.m_data[2] = 10;
  local_388.uvwBits.m_data[0] = 5;
  local_388.uvwBits.m_data[1] = 5;
  local_388.uvwBits.m_data[2] = 0;
  lodPrec.derivateBits = 10;
  lodPrec.lodBits = 6;
  if ((int)((ulong)((long)gridLayout.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)gridLayout.
                         super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) < 1) {
    bVar5 = false;
    iVar6 = 0;
  }
  else {
    local_3f0 = local_3f0 + 0x26;
    uVar14 = 0;
    lVar12 = 0xc;
    iVar6 = 0;
    do {
      iVar9 = *(int *)((long)(gridLayout.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12 + -0xc);
      iVar2 = *(int *)((long)(gridLayout.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12 + -8);
      iVar3 = *(int *)((long)(gridLayout.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12 + -4);
      height = *(int *)((long)(gridLayout.
                               super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12);
      glu::TextureTestUtil::computeQuadTexCoordCube
                (&texCoord,(int)uVar14 + (int)((uVar14 & 0xffffffff) / 6) * -6);
      (*(this->super_TestInstance)._vptr_TestInstance[3])(this,local_12c,uVar14 & 0xffffffff);
      tcu::SurfaceAccess::SurfaceAccess
                ((SurfaceAccess *)&res,&referenceFrame,&local_428,iVar9,iVar2,iVar3,height);
      auStack_334._12_4_ = (undefined4)local_3f0[6];
      auStack_334._16_4_ = (undefined4)((ulong)local_3f0[6] >> 0x20);
      rnd.m_rnd._0_8_ = *local_3f0;
      rnd.m_rnd._8_8_ = local_3f0[1];
      local_348._M_allocated_capacity = local_3f0[2];
      local_348._8_8_ = local_3f0[3];
      local_338 = (int)local_3f0[4];
      auStack_334._0_4_ = (undefined4)((ulong)local_3f0[4] >> 0x20);
      auStack_334._4_4_ = (undefined4)local_3f0[5];
      auStack_334._8_4_ = (undefined4)((ulong)local_3f0[5] >> 0x20);
      glu::TextureTestUtil::sampleTexture
                ((SurfaceAccess *)&res,(TextureCubeView *)&rnd,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,(ReferenceParams *)local_12c);
      rnd.m_rnd.x = 8;
      rnd.m_rnd.y = 3;
      pvVar13 = (void *)renderedFrame.m_pixels.m_cap;
      if (renderedFrame.m_pixels.m_cap != 0) {
        pvVar13 = renderedFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_470,(TextureFormat *)&rnd,renderedFrame.m_width,
                 renderedFrame.m_height,1,pvVar13);
      tcu::getSubregion((PixelBufferAccess *)&res,(PixelBufferAccess *)local_470,iVar9,iVar2,iVar3,
                        height);
      rnd.m_rnd.x = 8;
      rnd.m_rnd.y = 3;
      pvVar13 = (void *)referenceFrame.m_pixels.m_cap;
      if (referenceFrame.m_pixels.m_cap != 0) {
        pvVar13 = referenceFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_418,(TextureFormat *)&rnd,referenceFrame.m_width,
                 referenceFrame.m_height,1,pvVar13);
      tcu::getSubregion((PixelBufferAccess *)local_4a0,(PixelBufferAccess *)local_418,iVar9,iVar2,
                        iVar3,height);
      rnd.m_rnd.x = 8;
      rnd.m_rnd.y = 3;
      pvVar13 = (void *)errorMask.m_pixels.m_cap;
      if (errorMask.m_pixels.m_cap != 0) {
        pvVar13 = errorMask.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                (&local_98,(TextureFormat *)&rnd,errorMask.m_width,errorMask.m_height,1,pvVar13);
      tcu::getSubregion((PixelBufferAccess *)local_4c8,&local_98,iVar9,iVar2,iVar3,height);
      iVar9 = (*(((this->m_texture).m_ptr)->super_TestTexture)._vptr_TestTexture[0x11])();
      lVar10 = CONCAT44(extraout_var_00,iVar9);
      auStack_334._12_4_ = (undefined4)*(undefined8 *)(lVar10 + 0x160);
      auStack_334._16_4_ = (undefined4)((ulong)*(undefined8 *)(lVar10 + 0x160) >> 0x20);
      rnd.m_rnd._0_8_ = *(undefined8 *)(lVar10 + 0x130);
      rnd.m_rnd._8_8_ = *(undefined8 *)(lVar10 + 0x138);
      local_348._M_allocated_capacity = *(long *)(lVar10 + 0x140);
      local_348._8_8_ = *(undefined8 *)(lVar10 + 0x148);
      local_338 = (int)*(undefined8 *)(lVar10 + 0x150);
      auStack_334._0_4_ = (undefined4)((ulong)*(undefined8 *)(lVar10 + 0x150) >> 0x20);
      auStack_334._4_4_ = (undefined4)*(undefined8 *)(lVar10 + 0x158);
      auStack_334._8_4_ = (undefined4)((ulong)*(undefined8 *)(lVar10 + 0x158) >> 0x20);
      iVar9 = glu::TextureTestUtil::computeTextureLookupDiff
                        ((ConstPixelBufferAccess *)&res,(ConstPixelBufferAccess *)local_4a0,
                         (PixelBufferAccess *)local_4c8,(TextureCubeView *)&rnd,
                         texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start,(ReferenceParams *)local_12c,&local_388,
                         &lodPrec,((this->super_TestInstance).m_context)->m_testCtx->m_watchDog);
      iVar6 = iVar6 + iVar9;
      uVar14 = uVar14 + 1;
      lVar12 = lVar12 + 0x10;
    } while ((long)uVar14 <
             (long)(int)((ulong)((long)gridLayout.
                                       super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)gridLayout.
                                      super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4));
    if (iVar6 < 1) {
      bVar5 = false;
    }
    else {
      rnd.m_rnd._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
      this_01 = &rnd.m_rnd.z;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_01,"ERROR: Image verification failed, found ",0x28);
      std::ostream::operator<<(this_01,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," invalid pixels!",0x10)
      ;
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
      std::ios_base::~ios_base(local_2e0);
      iVar6 = 1;
      bVar5 = true;
    }
  }
  pTVar4 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_470._0_8_ = (long)local_470 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"Result","");
  local_4a0._0_8_ = (long)local_4a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4a0,"Verification result","");
  tcu::LogImageSet::LogImageSet((LogImageSet *)&res,(string *)local_470,(string *)local_4a0);
  tcu::TestLog::startImageSet(pTVar4,(char *)CONCAT44(res.m_data[1],res.m_data[0]),local_1b8._M_p);
  local_418._0_8_ = (long)local_418 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"Rendered","");
  local_4c8._0_8_ = (long)local_4c8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"Rendered image","");
  pSVar11 = &renderedFrame;
  tcu::LogImage::LogImage
            ((LogImage *)&rnd,(string *)local_418,(string *)local_4c8,pSVar11,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)&rnd,(int)pTVar4,__buf,(size_t)pSVar11);
  if ((undefined1 *)CONCAT44(auStack_334._0_4_,local_338) != auStack_334 + 0xc) {
    operator_delete((undefined1 *)CONCAT44(auStack_334._0_4_,local_338),
                    CONCAT44(auStack_334._16_4_,auStack_334._12_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rnd.m_rnd._0_8_ != &local_348) {
    operator_delete((void *)rnd.m_rnd._0_8_,(ulong)(local_348._M_allocated_capacity + 1));
  }
  if (local_4c8._0_8_ != (long)local_4c8 + 0x10) {
    operator_delete((void *)local_4c8._0_8_,local_4c8._16_8_ + 1);
  }
  if (local_418._0_8_ != (long)local_418 + 0x10) {
    operator_delete((void *)local_418._0_8_,local_418._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_p != local_1a8) {
    operator_delete(local_1b8._M_p,local_1a8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(res.m_data[1],res.m_data[0]) != &local_1c8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(res.m_data[1],res.m_data[0]),local_1c8._M_allocated_capacity + 1);
  }
  if (local_4a0._0_8_ != (long)local_4a0 + 0x10) {
    operator_delete((void *)local_4a0._0_8_,local_4a0._16_8_ + 1);
  }
  if (local_470._0_8_ != (long)local_470 + 0x10) {
    operator_delete((void *)local_470._0_8_,local_470._16_8_ + 1);
  }
  if (bVar5) {
    pTVar4 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
    local_470._0_8_ = (long)local_470 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"Reference","");
    local_4a0._0_8_ = (long)local_4a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4a0,"Ideal reference","");
    pSVar11 = &referenceFrame;
    tcu::LogImage::LogImage
              ((LogImage *)&rnd,(string *)local_470,(string *)local_4a0,pSVar11,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    iVar9 = (int)pTVar4;
    tcu::LogImage::write((LogImage *)&rnd,iVar9,__buf_00,(size_t)pSVar11);
    local_418._0_8_ = (long)local_418 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"ErrorMask","");
    local_4c8._0_8_ = (long)local_4c8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"Error mask","");
    pSVar11 = &errorMask;
    tcu::LogImage::LogImage
              ((LogImage *)&res,(string *)local_418,(string *)local_4c8,pSVar11,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&res,iVar9,__buf_01,(size_t)pSVar11);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_p != local_1a8) {
      operator_delete(local_1b8._M_p,local_1a8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(res.m_data[1],res.m_data[0]) != &local_1c8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(res.m_data[1],res.m_data[0]),local_1c8._M_allocated_capacity + 1);
    }
    if (local_4c8._0_8_ != (long)local_4c8 + 0x10) {
      operator_delete((void *)local_4c8._0_8_,local_4c8._16_8_ + 1);
    }
    if (local_418._0_8_ != (long)local_418 + 0x10) {
      operator_delete((void *)local_418._0_8_,local_418._16_8_ + 1);
    }
    if ((undefined1 *)CONCAT44(auStack_334._0_4_,local_338) != auStack_334 + 0xc) {
      operator_delete((undefined1 *)CONCAT44(auStack_334._0_4_,local_338),
                      CONCAT44(auStack_334._16_4_,auStack_334._12_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rnd.m_rnd._0_8_ != &local_348) {
      operator_delete((void *)rnd.m_rnd._0_8_,(ulong)(local_348._M_allocated_capacity + 1));
    }
    if (local_4a0._0_8_ != (long)local_4a0 + 0x10) {
      operator_delete((void *)local_4a0._0_8_,local_4a0._16_8_ + 1);
    }
    if (local_470._0_8_ != (long)local_470 + 0x10) {
      operator_delete((void *)local_470._0_8_,local_470._16_8_ + 1);
    }
  }
  tcu::TestLog::endImageSet(((this->super_TestInstance).m_context)->m_testCtx->m_log);
  rnd.m_rnd._0_8_ = &local_348;
  if (iVar6 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&rnd,"pass","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,rnd.m_rnd._0_8_,
               rnd.m_rnd._8_8_ + rnd.m_rnd._0_8_);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&rnd,"fail","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,rnd.m_rnd._0_8_,
               rnd.m_rnd._8_8_ + rnd.m_rnd._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rnd.m_rnd._0_8_ != &local_348) {
    operator_delete((void *)rnd.m_rnd._0_8_,(ulong)(local_348._M_allocated_capacity + 1));
  }
  tcu::Surface::~Surface(&errorMask);
  tcu::Surface::~Surface(&referenceFrame);
  if (gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(gridLayout.
                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)gridLayout.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)gridLayout.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&renderedFrame);
  if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus TextureCubeLodControlTestInstance::iterate (void)
{
	const tcu::Sampler::WrapMode	wrapS			= Sampler::CLAMP_TO_EDGE;
	const tcu::Sampler::WrapMode	wrapT			= Sampler::CLAMP_TO_EDGE;
	const tcu::Sampler::FilterMode	magFilter		= Sampler::NEAREST;

	const tcu::TextureCube&			refTexture		= m_texture->getTexture();
	const int						viewportWidth	= m_renderer.getRenderWidth();
	const int						viewportHeight	= m_renderer.getRenderHeight();

	tcu::Sampler					sampler			= util::createSampler(wrapS, wrapT, m_minFilter, magFilter);
	ReferenceParams					refParams		(TEXTURETYPE_CUBE, sampler);
	vector<float>					texCoord;
	tcu::Surface					renderedFrame	(viewportWidth, viewportHeight);

	refParams.maxLevel = deLog2Floor32(m_texSize);

	// Compute grid.
	vector<tcu::IVec4> gridLayout;
	computeGridLayout(gridLayout, viewportWidth, viewportHeight);

	for (int cellNdx = 0; cellNdx < (int)gridLayout.size(); cellNdx++)
	{
		const int			curX		= gridLayout[cellNdx].x();
		const int			curY		= gridLayout[cellNdx].y();
		const int			curW		= gridLayout[cellNdx].z();
		const int			curH		= gridLayout[cellNdx].w();
		const tcu::CubeFace	cubeFace	= (tcu::CubeFace)(cellNdx % tcu::CUBEFACE_LAST);

		computeQuadTexCoordCube(texCoord, cubeFace);
		getReferenceParams(refParams, cellNdx);

		// Render with GL.
		m_renderer.setViewport((float)curX, (float)curY, (float)curW, (float)curH);
		m_renderer.getTextureBinding(0)->updateTextureViewMipLevels(refParams.baseLevel, refParams.maxLevel);
		m_renderer.renderQuad(renderedFrame, 0, &texCoord[0], refParams);
	}

	// Render reference and compare
	{
		const tcu::IVec4		formatBitDepth		= getTextureFormatBitDepth(mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
		const tcu::PixelFormat	pixelFormat			(formatBitDepth[0], formatBitDepth[1], formatBitDepth[2], formatBitDepth[3]);
		tcu::Surface			referenceFrame		(viewportWidth, viewportHeight);
		tcu::Surface			errorMask			(viewportWidth, viewportHeight);
		int						numFailedPixels		= 0;
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec				(tcu::LodPrecision::RULE_VULKAN);

		// Params for rendering reference
		refParams.sampler					= util::createSampler(wrapS, wrapT, m_testParameters.minFilter, magFilter);
		refParams.sampler.seamlessCubeMap	= true;
		refParams.lodMode					= LODMODE_EXACT;

		// Comparison parameters
		lookupPrec.colorMask				= getCompareMask(pixelFormat);
		lookupPrec.colorThreshold			= tcu::computeFixedPointThreshold(max(getBitsVec(pixelFormat)-2, IVec4(0)));
		lookupPrec.coordBits				= tcu::IVec3(10);
		lookupPrec.uvwBits					= tcu::IVec3(5,5,0);
		lodPrec.derivateBits				= 10;
		lodPrec.lodBits						= 6;

		for (int cellNdx = 0; cellNdx < (int)gridLayout.size(); cellNdx++)
		{
			const int				curX		= gridLayout[cellNdx].x();
			const int				curY		= gridLayout[cellNdx].y();
			const int				curW		= gridLayout[cellNdx].z();
			const int				curH		= gridLayout[cellNdx].w();
			const tcu::CubeFace		cubeFace	= (tcu::CubeFace)(cellNdx % tcu::CUBEFACE_LAST);

			computeQuadTexCoordCube(texCoord, cubeFace);
			getReferenceParams(refParams, cellNdx);

			// Render ideal reference.
			{
				tcu::SurfaceAccess idealDst(referenceFrame, pixelFormat, curX, curY, curW, curH);
				sampleTexture(idealDst, refTexture, &texCoord[0], refParams);
			}

			// Compare this cell
			numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
														tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
														tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
														m_texture->getTexture(), &texCoord[0], refParams,
														lookupPrec, lodPrec,  m_context.getTestContext().getWatchDog());
		}

		if (numFailedPixels > 0)
			 m_context.getTestContext().getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

		 m_context.getTestContext().getLog() << TestLog::ImageSet("Result", "Verification result")
											 << TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			 m_context.getTestContext().getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
												 << TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		 m_context.getTestContext().getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			return isOk ? tcu::TestStatus::pass("pass") : tcu::TestStatus::fail("fail");
		}
	}
}